

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O2

vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
* __thiscall
json::JsonObject::sort_abi_cxx11_
          (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
           *__return_storage_ptr__,JsonObject *this)

{
  long lVar1;
  pointer ppVar2;
  ulong uVar3;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  *__range1;
  __node_base *p_Var4;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>_>
  __i;
  long lVar5;
  pointer ppVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>
  *pair;
  pointer ppVar7;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  temp;
  _Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  local_58;
  Value *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::reserve((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
             *)&local_58,(this->children)._M_h._M_element_count);
  p_Var4 = &(this->children)._M_h._M_before_begin;
  while (ppVar7 = local_58._M_impl.super__Vector_impl_data._M_finish,
        ppVar2 = local_58._M_impl.super__Vector_impl_data._M_start, p_Var4 = p_Var4->_M_nxt,
        p_Var4 != (__node_base *)0x0) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1);
    local_40 = (Value *)(p_Var4 + 5);
    std::
    vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
    ::emplace_back<std::__cxx11::string_const*,json::JsonObject::Value*>
              ((vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
                *)&local_58,&local_38,&local_40);
  }
  if (local_58._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58._M_impl.super__Vector_impl_data._M_start;
    uVar3 = lVar5 >> 4;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
              (local_58._M_impl.super__Vector_impl_data._M_start,
               local_58._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar5 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
                (ppVar2,ppVar7);
    }
    else {
      ppVar6 = ppVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
                (ppVar2,ppVar6);
      for (; ppVar6 != ppVar7; ppVar6 = ppVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,__gnu_cxx::__ops::_Val_comp_iter<json::JsonObject::sort()::__0>>
                  (ppVar6);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  ::reserve(__return_storage_ptr__,(this->children)._M_h._M_element_count);
  ppVar2 = local_58._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = local_58._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
      ppVar7 = ppVar7 + 1) {
    std::
    vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
    ::emplace_back<std::__cxx11::string_const&,json::JsonNode&>
              ((vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
                *)__return_storage_ptr__,ppVar7->first,
               (ppVar7->second->node)._M_t.
               super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
               super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
               super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
  }
  std::
  _Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<const std::string &, JsonNode &>> JsonObject::sort()
    {
        // Create a new vector and reserve enough space.
        std::vector<std::pair<const std::string *, Value *>> temp;
        temp.reserve(children.size());

        // Fill up the array.
        for (auto &pair : children)
            temp.emplace_back(&pair.first, &pair.second);

        // Sort the array based on the insertion order.
        std::sort(temp.begin(), temp.end(), [](const std::pair<const std::string *, Value *> &left, const std::pair<const std::string *, Value *> &right) {
            return left.second->orderIndex < right.second->orderIndex;
        });

        // We don't want to return a vector of std::pair<const std::string *, Value*>
        // therefore we create a new vector of the type we want to return.
        std::vector<std::pair<const std::string &, JsonNode &>> result;
        result.reserve(children.size());

        for (auto &pair : temp)
            result.emplace_back(*pair.first, *pair.second->node);

        return result;
    }